

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O3

int fy_parse_document_load_end(fy_parser *fyp,fy_document *fyd,fy_eventp *fyep)

{
  fy_atom *pfVar1;
  fy_token *fyt;
  char *fmt;
  fy_atom *handle;
  undefined1 local_88 [56];
  char *pcStack_50;
  fy_diag_report_ctx local_48;
  
  handle = (fy_atom *)&local_48;
  if (fyep == (fy_eventp *)0x0) {
    if ((fyp->field_0x70 & 0x10) != 0) {
      pcStack_50 = (char *)0x11dd29;
      fy_parser_diag(fyp,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                     ,0x69b,"fy_parse_document_load_end","no event to process");
      goto LAB_0011dd29;
    }
    local_48.has_override = false;
    local_48._17_7_ = 0;
    local_48.override_file = (char *)0x0;
    local_48.override_line = 0;
    local_48.override_column = 0;
    local_48.type = FYET_ERROR;
    local_48.module = FYEM_DOC;
    handle = (fy_atom *)local_88;
    pfVar1 = fy_fill_atom_at(fyp,0,0,handle);
    local_48.fyt = fy_token_create(FYTT_INPUT_MARKER,pfVar1);
    fmt = "premature end of event stream";
  }
  else {
    pcStack_50 = fy_event_type_txt[(fyep->e).type];
    local_88._48_8_ = "fy_parse_document_load_end";
    local_88._40_8_ = (fy_input *)0x11dc3e;
    fy_parser_diag(fyp,0x40,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                   ,0x6a1,"fy_parse_document_load_end","in %s [%s]");
    handle = (fy_atom *)&local_48;
    if ((fyep->e).type == FYET_DOCUMENT_END) {
      pcStack_50 = (char *)0x11dc53;
      fy_parse_eventp_recycle(fyp,fyep);
      return 0;
    }
    local_48.has_override = false;
    local_48._17_7_ = 0;
    local_48.override_file = (char *)0x0;
    local_48.override_line = 0;
    local_48.override_column = 0;
    local_48.type = FYET_ERROR;
    local_48.module = FYEM_DOC;
    pcStack_50 = (char *)0x11dcde;
    fyt = fy_document_event_get_token(&fyep->e);
    pcStack_50 = (char *)0x11dce6;
    local_48.fyt = fy_token_ref(fyt);
    fmt = "bad event";
  }
  *(undefined8 *)&handle[-1].increment = 0x11dcfe;
  fy_parser_diag_report(fyp,&local_48,fmt);
LAB_0011dd29:
  *(undefined8 *)((long)handle + -8) = 0x11dd34;
  fy_parse_eventp_recycle(fyp,fyep);
  return -1;
}

Assistant:

int fy_parse_document_load_end(struct fy_parser *fyp, struct fy_document *fyd, struct fy_eventp *fyep) {
    struct fy_event *fye;
    int rc;

    fyp_error_check(fyp, fyep || !fyp->stream_error, err_out,
                    "no event to process");

    FYP_PARSE_ERROR_CHECK(fyp, 0, 0, FYEM_DOC,
                          fyep, err_out,
                          "premature end of event stream");

    fyp_doc_debug(fyp, "in %s [%s]", __func__, fy_event_type_txt[fyep->e.type]);

    fye = &fyep->e;

    FYP_TOKEN_ERROR_CHECK(fyp, fy_document_event_get_token(fye), FYEM_DOC,
                          fye->type == FYET_DOCUMENT_END, err_out,
                          "bad event");

    /* recycle the document end event */
    fy_parse_eventp_recycle(fyp, fyep);

    return 0;
    err_out:
    rc = -1;
    fy_parse_eventp_recycle(fyp, fyep);
    return rc;
}